

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

bool __thiscall Am_Object::Is_Part_Of(Am_Object *this,Am_Object *in_owner)

{
  Am_Object_Data *pAVar1;
  
  do {
    pAVar1 = this->data;
    if (pAVar1 == (Am_Object_Data *)0x0) break;
    this = (Am_Object *)&(pAVar1->owner_slot).super_Am_Value.value;
  } while (pAVar1 != in_owner->data);
  return pAVar1 != (Am_Object_Data *)0x0;
}

Assistant:

bool
Am_Object::Is_Part_Of(Am_Object in_owner) const
{
  Am_Object_Data *current = data;
  while (current) {
    if (current == in_owner.data)
      return true;
    current = (Am_Object_Data *)current->owner_slot.value.wrapper_value;
  }
  return false;
}